

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O2

void Diligent::HashCombine<unsigned_int,Diligent::SamplerDesc>
               (size_t *Seed,uint *FirstArg,SamplerDesc *RestArgs)

{
  HashCombine<unsigned_int>(Seed,FirstArg);
  HashCombine<Diligent::SamplerDesc>(Seed,RestArgs);
  return;
}

Assistant:

void HashCombine(std::size_t& Seed, const FirstArgType& FirstArg, const RestArgsType&... RestArgs) noexcept
{
    HashCombine(Seed, FirstArg);
    HashCombine(Seed, RestArgs...); // recursive call using pack expansion syntax
}